

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

PNode * resolve_ambiguities(Parser *p,PNode *pn)

{
  char *pcVar1;
  PNode *pn_00;
  bool bVar2;
  int iVar3;
  PNode *local_78;
  bool local_69;
  PNode *_t;
  uint found;
  uint i;
  anon_struct_40_4_d8687ec6 pns;
  D_ParseNode *pDStack_28;
  uint efa;
  D_ParseNode *res;
  PNode *amb;
  PNode *pn_local;
  Parser *p_local;
  
  found = 0;
  pns.n = 0;
  pns.i = 0;
  local_69 = false;
  if ((pn->parse_node).start_loc.s == (pn->parse_node).end) {
    iVar3 = final_actionless(pn);
    local_69 = iVar3 != 0;
  }
  pns.e[2]._4_4_ = (uint)local_69;
  if (pns._0_8_ == 0) {
    pns._0_8_ = &pns.v;
    pns.e[(ulong)found - 1] = &pn->parse_node;
    found = found + 1;
  }
  else {
    if ((D_ParseNode ***)pns._0_8_ == &pns.v) {
      if (found < 3) {
        *(D_ParseNode **)(pns._0_8_ + (ulong)found * 8) = &pn->parse_node;
        found = found + 1;
        goto LAB_00157b1e;
      }
    }
    else if ((found & 7) != 0) {
      *(D_ParseNode **)(pns._0_8_ + (ulong)found * 8) = &pn->parse_node;
      found = found + 1;
      goto LAB_00157b1e;
    }
    vec_add_internal(&found,&pn->parse_node);
  }
LAB_00157b1e:
  res = (D_ParseNode *)pn->ambiguities;
  do {
    if (res == (D_ParseNode *)0x0) {
      if (found == 1) {
        pDStack_28 = *(D_ParseNode **)pns._0_8_;
      }
      else {
        pDStack_28 = (*(p->user).ambiguity_fn)(&p->user,found,(D_ParseNode **)pns._0_8_);
      }
      if ((pns._0_8_ != 0) && ((D_ParseNode ***)pns._0_8_ != &pns.v)) {
        free((void *)pns._0_8_);
      }
      if (pDStack_28 == (D_ParseNode *)0x0) {
        local_78 = (PNode *)0x0;
      }
      else {
        local_78 = (PNode *)(pDStack_28 + -2);
      }
      return local_78;
    }
    bVar2 = false;
    while (res[1].end != *(char **)(res[1].end + 0x70)) {
      pcVar1 = *(char **)(res[1].end + 0x70);
      *(int *)(pcVar1 + 0x14) = *(int *)(pcVar1 + 0x14) + 1;
      iVar3 = *(int *)(res[1].end + 0x14) + -1;
      *(int *)(res[1].end + 0x14) = iVar3;
      if (iVar3 == 0) {
        free_PNode(p,(PNode *)res[1].end);
      }
      res[1].end = pcVar1;
    }
    pn_00 = (PNode *)res[1].end;
    if (((((p->user).dont_merge_epsilon_trees != 0) || (pns.e[2]._4_4_ == 0)) ||
        ((pn_00->parse_node).start_loc.s != (pn_00->parse_node).end)) ||
       (iVar3 = final_actionless(pn_00), iVar3 == 0)) {
      for (_t._4_4_ = 0; _t._4_4_ < found; _t._4_4_ = _t._4_4_ + 1) {
        if ((D_ParseNode *)*(undefined1 **)(pns._0_8_ + (ulong)_t._4_4_ * 8) == &pn_00->parse_node)
        {
          bVar2 = true;
        }
      }
      if (!bVar2) {
        if (pns._0_8_ == 0) {
          pns._0_8_ = &pns.v;
          pns.e[(ulong)found - 1] = &pn_00->parse_node;
          found = found + 1;
        }
        else if ((D_ParseNode ***)pns._0_8_ == &pns.v) {
          if (found < 3) {
            *(D_ParseNode **)(pns._0_8_ + (ulong)found * 8) = &pn_00->parse_node;
            found = found + 1;
          }
          else {
LAB_00157cde:
            vec_add_internal(&found,&pn_00->parse_node);
          }
        }
        else {
          if ((found & 7) == 0) goto LAB_00157cde;
          *(D_ParseNode **)(pns._0_8_ + (ulong)found * 8) = &pn_00->parse_node;
          found = found + 1;
        }
      }
    }
    res = (D_ParseNode *)pn_00->ambiguities;
  } while( true );
}

Assistant:

static PNode *resolve_ambiguities(Parser *p, PNode *pn) {
  PNode *amb;
  D_ParseNode *res;
  uint efa;
  Vec(D_ParseNode *) pns;

  vec_clear(&pns);
  efa = is_epsilon_PNode(pn) && final_actionless(pn);
  vec_add(&pns, &pn->parse_node);
  for (amb = pn->ambiguities; amb; amb = amb->ambiguities) {
    uint i, found = 0;
    LATEST(p, amb);
    if (!p->user.dont_merge_epsilon_trees)
      if (efa && is_epsilon_PNode(amb) && final_actionless(amb)) continue;
    for (i = 0; i < pns.n; i++)
      if (pns.v[i] == &amb->parse_node) found = 1;
    if (!found) vec_add(&pns, &amb->parse_node);
  }
  if (pns.n == 1) {
    res = pns.v[0];
    goto Ldone;
  }
  res = p->user.ambiguity_fn((D_Parser *)p, pns.n, pns.v);
Ldone:
  vec_free(&pns);
  return D_ParseNode_to_PNode(res);
}